

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::LinTickIterator::GetNextTick
          (LinTickIterator *this,float *outTick,bool *outIsMajorTick,string *outFormatString)

{
  string *outFormatString_local;
  bool *outIsMajorTick_local;
  float *outTick_local;
  LinTickIterator *this_local;
  
  if ((this->super_TickIterator).mAxisSetup == (AxisSetup *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->mCurrentTick <= ((this->super_TickIterator).mAxisSetup)->mMax * 1.0001) {
    *outTick = this->mCurrentTick;
    *outIsMajorTick =
         this->mCount % (long)(((this->super_TickIterator).mAxisSetup)->mTickInfo).mTickDivision ==
         0;
    std::__cxx11::string::operator=((string *)outFormatString,(string *)&this->mFormatString);
    this->mCurrentTick = this->mDelta + this->mCurrentTick;
    this->mCount = this->mCount + 1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LinTickIterator::GetNextTick (float &outTick, bool &outIsMajorTick, string &outFormatString) {
      if (!mAxisSetup) {
        return false;
      }
      if (mCurrentTick>mAxisSetup->mMax*kLittleIncrease) {
        return false;
      }
      outTick = mCurrentTick;
      outIsMajorTick = (mCount%mAxisSetup->mTickInfo.mTickDivision == 0);
      outFormatString = mFormatString;

      mCurrentTick += mDelta;
      mCount++;
      return true;
    }